

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

ArrayNewElem * __thiscall
wasm::Builder::makeArrayNewElem
          (Builder *this,HeapType type,Name seg,Expression *offset,Expression *size)

{
  ArrayNewElem *this_00;
  Type local_40;
  HeapType local_38;
  
  local_38.id = type.id;
  this_00 = MixedArena::alloc<wasm::ArrayNewElem>(&this->wasm->allocator);
  (this_00->segment).super_IString.str._M_len = seg.super_IString.str._M_len;
  (this_00->segment).super_IString.str._M_str = seg.super_IString.str._M_str;
  this_00->offset = offset;
  this_00->size = size;
  wasm::Type::Type(&local_40,local_38,NonNullable,Inexact);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id =
       local_40.id;
  ArrayNewElem::finalize(this_00);
  return this_00;
}

Assistant:

ArrayNewElem* makeArrayNewElem(HeapType type,
                                 Name seg,
                                 Expression* offset,
                                 Expression* size) {
    auto* ret = wasm.allocator.alloc<ArrayNewElem>();
    ret->segment = seg;
    ret->offset = offset;
    ret->size = size;
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }